

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManMergeDist1Pairs2(Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *pCube1_00;
  word *pCube2_00;
  word *pBig;
  word *pSmall;
  word *pCube2;
  word *pCube2Out;
  word *pCube1;
  word *pCube1Out;
  int Count;
  int iCube2;
  int iCube1;
  int c2;
  int c1;
  int w;
  Vec_Int_t *vGroupPrev_local;
  Vec_Int_t *vGroup_local;
  Mop_Man_t *p_local;
  
  pCube1Out._0_4_ = 0;
  iCube1 = 0;
  do {
    iVar1 = Vec_IntSize(vGroup);
    if (iVar1 <= iCube1) {
      if ((int)pCube1Out != 0) {
        Map_ManGroupCompact(vGroup);
      }
      return (int)pCube1Out;
    }
    iVar1 = Vec_IntEntry(vGroup,iCube1);
    if (iVar1 != -1) {
      pCube1_00 = Mop_ManCubeIn(p,iVar1);
      iCube2 = iCube1;
      while( true ) {
        iCube2 = iCube2 + 1;
        iVar2 = Vec_IntSize(vGroup);
        if (iVar2 <= iCube2) break;
        iVar2 = Vec_IntEntry(vGroup,iCube2);
        if (iVar2 != -1) {
          pCube2_00 = Mop_ManCubeIn(p,iVar2);
          iVar3 = Mop_ManCheckDist1(pCube1_00,pCube2_00,p->nWordsIn);
          if (iVar3 != 0) {
            pBig = Mop_ManCubeOut(p,iVar1);
            pSmall = Mop_ManCubeOut(p,iVar2);
            iVar3 = memcmp(pBig,pSmall,(long)p->nWordsOut << 3);
            if (iVar3 == 0) {
              __assert_fail("memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                            ,0x226,
                            "int Mop_ManMergeDist1Pairs2(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *)");
            }
            iVar3 = Mop_ManCheckContain(pBig,pSmall,p->nWordsOut);
            if (iVar3 == 0) {
              iVar2 = Mop_ManCheckContain(pSmall,pBig,p->nWordsOut);
              if (iVar2 != 0) {
                for (c2 = 0; c2 < p->nWordsIn; c2 = c2 + 1) {
                  pCube1_00[c2] = pCube2_00[c2] & pCube1_00[c2];
                }
                for (c2 = 0; c2 < p->nWordsOut; c2 = c2 + 1) {
                  pSmall[c2] = (pBig[c2] ^ 0xffffffffffffffff) & pSmall[c2];
                }
                Vec_IntPush(vGroupPrev,iVar1);
                Vec_IntWriteEntry(vGroup,iCube1,-1);
                pCube1Out._0_4_ = (int)pCube1Out + 1;
              }
            }
            else {
              for (c2 = 0; c2 < p->nWordsIn; c2 = c2 + 1) {
                pCube2_00[c2] = pCube1_00[c2] & pCube2_00[c2];
              }
              for (c2 = 0; c2 < p->nWordsOut; c2 = c2 + 1) {
                pBig[c2] = (pSmall[c2] ^ 0xffffffffffffffff) & pBig[c2];
              }
              Vec_IntPush(vGroupPrev,iVar2);
              Vec_IntWriteEntry(vGroup,iCube2,-1);
              pCube1Out._0_4_ = (int)pCube1Out + 1;
            }
          }
        }
      }
    }
    iCube1 = iCube1 + 1;
  } while( true );
}

Assistant:

int Mop_ManMergeDist1Pairs2( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev )
{
    int w, c1, c2, iCube1, iCube2, Count = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            assert( memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) );
            if ( Mop_ManCheckContain(pCube1Out, pCube2Out, p->nWordsOut) ) // pCube1 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube2[w] &= pCube1[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube1Out[w] &= ~pCube2Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube2 );
                Vec_IntWriteEntry( vGroup, c2, -1 );
                Count++;
            }
            else if ( Mop_ManCheckContain(pCube2Out, pCube1Out, p->nWordsOut) ) // pCube2 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube1[w] &= pCube2[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube2Out[w] &= ~pCube1Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube1 );
                Vec_IntWriteEntry( vGroup, c1, -1 );
                Count++;
            }
        }
    }
    if ( Count )
        Map_ManGroupCompact( vGroup );
    return Count;
}